

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.c
# Opt level: O0

void kill_use_list(dmr_C *C,pseudo_list *list)

{
  pseudo_t *usep;
  undefined1 local_38 [8];
  ptr_list_iter piter__;
  pseudo_t p;
  pseudo_list *list_local;
  dmr_C *C_local;
  
  ptrlist_forward_iterator((ptr_list_iter *)local_38,(ptr_list *)list);
  piter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_38);
  while (piter__._16_8_ != 0) {
    if ((pseudo *)piter__._16_8_ != &C->L->void_pseudo) {
      usep = (pseudo_t *)ptrlist_iter_this_address((ptr_list_iter *)local_38);
      dmrC_kill_use(C,usep);
    }
    piter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_38);
  }
  return;
}

Assistant:

static void kill_use_list(struct dmr_C *C, struct pseudo_list *list)
{
	pseudo_t p;
	FOR_EACH_PTR(list, p) {
		if (p == VOID_PSEUDO(C))
			continue;
		dmrC_kill_use(C, THIS_ADDRESS(pseudo_t, p));
	} END_FOR_EACH_PTR(p);
}